

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

DictionaryValue *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::DictionaryValue>
          (Arena *arena)

{
  DictionaryValue *pDVar1;
  
  if (arena != (Arena *)0x0) {
    pDVar1 = DoCreateMessage<CoreML::Specification::MILSpec::DictionaryValue>(arena);
    return pDVar1;
  }
  pDVar1 = (DictionaryValue *)operator_new(0x30);
  CoreML::Specification::MILSpec::DictionaryValue::DictionaryValue(pDVar1,(Arena *)0x0,false);
  return pDVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }